

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChArchiveOut::out<chrono::ChQuaternion<double>>
          (ChArchiveOut *this,ChNameValue<chrono::ChQuaternion<double>_> *bVal)

{
  byte *pbVar1;
  ChExceptionArchive *this_00;
  char *pcVar2;
  ChQuaternion<double> *mvalp;
  char *pcVar3;
  undefined1 local_e0 [8];
  ChValueSpecific<chrono::ChQuaternion<double>_> specVal;
  string local_98 [32];
  char local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  ChQuaternion<double> *local_38;
  ChQuaternion<double> *mptr;
  size_t sStack_28;
  bool already_stored;
  size_t obj_ID;
  ChNameValue<chrono::ChQuaternion<double>_> *pCStack_18;
  bool tracked;
  ChNameValue<chrono::ChQuaternion<double>_> *bVal_local;
  ChArchiveOut *this_local;
  
  obj_ID._7_1_ = 0;
  sStack_28 = 0;
  pCStack_18 = bVal;
  bVal_local = (ChNameValue<chrono::ChQuaternion<double>_> *)this;
  pbVar1 = (byte *)ChNameValue<chrono::ChQuaternion<double>_>::flags(bVal);
  if ((*pbVar1 & 1) != 0) {
    local_38 = ChNameValue<chrono::ChQuaternion<double>_>::value(bVal);
    PutPointer(this,local_38,(bool *)((long)&mptr + 7),&stack0xffffffffffffffd8);
    if ((mptr._7_1_ & 1) != 0) {
      specVal._ptr_to_val._2_1_ = 1;
      this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
      pcVar2 = ChNameValue<chrono::ChQuaternion<double>_>::name(bVal);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,pcVar2,(allocator *)((long)&specVal._ptr_to_val + 3));
      std::operator+(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              "Cannot serialize tracked object \'");
      std::operator+(local_58,local_78);
      ChExceptionArchive::ChExceptionArchive(this_00,local_58);
      specVal._ptr_to_val._2_1_ = 0;
      __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChExceptionArchive::~ChExceptionArchive);
    }
    obj_ID._7_1_ = 1;
  }
  mvalp = ChNameValue<chrono::ChQuaternion<double>_>::value(bVal);
  pcVar2 = ChNameValue<chrono::ChQuaternion<double>_>::name(bVal);
  pcVar3 = ChNameValue<chrono::ChQuaternion<double>_>::flags(bVal);
  ChValueSpecific<chrono::ChQuaternion<double>_>::ChValueSpecific
            ((ChValueSpecific<chrono::ChQuaternion<double>_> *)local_e0,mvalp,pcVar2,*pcVar3);
  (**(code **)(*(long *)this + 0x60))
            (this,(ChValueSpecific<chrono::ChQuaternion<double>_> *)local_e0,obj_ID._7_1_ & 1,
             sStack_28);
  ChValueSpecific<chrono::ChQuaternion<double>_>::~ChValueSpecific
            ((ChValueSpecific<chrono::ChQuaternion<double>_> *)local_e0);
  return;
}

Assistant:

void out (ChNameValue<T> bVal) {
          bool tracked = false;
          size_t obj_ID =0;
          if (bVal.flags() & NVP_TRACK_OBJECT)
          {
              bool already_stored; 
              T* mptr = &bVal.value();
              PutPointer(mptr, already_stored, obj_ID);
              if (already_stored) 
                  {throw (ChExceptionArchive( "Cannot serialize tracked object '" + std::string(bVal.name()) + "' by value, AFTER already serialized by pointer."));}
              tracked = true;
          }
          ChValueSpecific< T > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out(
              specVal,
              tracked, 
              obj_ID);
      }